

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav * drwav_open_ex(drwav_read_proc onRead,drwav_seek_proc onSeek,drwav_chunk_proc onChunk,
                     void *pReadSeekUserData,void *pChunkUserData,drwav_uint32 flags)

{
  drwav_bool32 dVar1;
  drwav *pWav;
  void *in_stack_00000110;
  void *in_stack_00000118;
  drwav_chunk_proc in_stack_00000120;
  drwav_seek_proc in_stack_00000128;
  drwav_read_proc in_stack_00000130;
  drwav *in_stack_00000138;
  drwav_uint32 in_stack_000002c0;
  drwav *local_8;
  
  local_8 = (drwav *)malloc(0x1a0);
  if (local_8 == (drwav *)0x0) {
    local_8 = (drwav *)0x0;
  }
  else {
    dVar1 = drwav_init_ex(in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000120,
                          in_stack_00000118,in_stack_00000110,in_stack_000002c0);
    if (dVar1 == 0) {
      free(local_8);
      local_8 = (drwav *)0x0;
    }
  }
  return local_8;
}

Assistant:

drwav* drwav_open_ex(drwav_read_proc onRead, drwav_seek_proc onSeek, drwav_chunk_proc onChunk, void* pReadSeekUserData, void* pChunkUserData, drwav_uint32 flags)
{
    drwav* pWav = (drwav*)DRWAV_MALLOC(sizeof(*pWav));
    if (pWav == NULL) {
        return NULL;
    }

    if (!drwav_init_ex(pWav, onRead, onSeek, onChunk, pReadSeekUserData, pChunkUserData, flags)) {
        DRWAV_FREE(pWav);
        return NULL;
    }

    return pWav;
}